

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O0

Top_dimensional_cells_iterator * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::Top_dimensional_cells_iterator::
operator++(Top_dimensional_cells_iterator *__return_storage_ptr__,
          Top_dimensional_cells_iterator *this)

{
  value_type vVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  bool bVar5;
  size_type local_28;
  size_t i;
  size_t dim;
  Top_dimensional_cells_iterator *this_local;
  
  i = 0;
  while( true ) {
    uVar2 = dimension(this->b);
    bVar5 = false;
    if (i != uVar2) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->counter,i);
      vVar1 = *pvVar3;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->b->sizes,i);
      bVar5 = vVar1 == *pvVar4 - 1;
    }
    if (!bVar5) break;
    i = i + 1;
  }
  uVar2 = dimension(this->b);
  if (i == uVar2) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->counter,0);
    *pvVar3 = *pvVar3 + 1;
  }
  else {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->counter,i);
    *pvVar3 = *pvVar3 + 1;
    for (local_28 = 0; local_28 != i; local_28 = local_28 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->counter,local_28);
      *pvVar3 = 0;
    }
  }
  Top_dimensional_cells_iterator(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Top_dimensional_cells_iterator operator++() {
      // first find first element of the counter that can be increased:
      std::size_t dim = 0;
      while ((dim != this->b->dimension()) && (this->counter[dim] == this->b->sizes[dim] - 1)) ++dim;

      if (dim != this->b->dimension()) {
        ++this->counter[dim];
        for (std::size_t i = 0; i != dim; ++i) {
          this->counter[i] = 0;
        }
      } else {
        ++this->counter[0];
      }
      return *this;
    }